

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall edition_unittest::TestFieldOrderings::ByteSizeLong(TestFieldOrderings *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  sVar5 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 8) != 0) {
    sVar5 = sVar5 + 6;
  }
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      lVar2 = *(long *)(((ulong)(this->field_0)._impl_.my_string_.tagged_ptr_.ptr_ &
                        0xfffffffffffffffc) + 8);
      uVar4 = (uint)lVar2 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar5 = sVar5 + lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar6 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestFieldOrderings_NestedMessage>
                        ((this->field_0)._impl_.optional_nested_message_);
      sVar5 = sVar5 + sVar6 + 2;
    }
    if ((uVar1 & 4) != 0) {
      uVar7 = (this->field_0)._impl_.my_int_ | 1;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar2 * 9 + 0x89U >> 6);
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestFieldOrderings::ByteSizeLong() const {
  const TestFieldOrderings& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestFieldOrderings)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000008u & cached_has_bits) * 6;
  if ((cached_has_bits & 0x00000007u) != 0) {
    // string my_string = 11;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_my_string());
    }
    // .edition_unittest.TestFieldOrderings.NestedMessage optional_nested_message = 200;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // int64 my_int = 1;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_my_int());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}